

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O1

void __thiscall
QSequentialAnimationGroupPrivate::_q_uncontrolledAnimationFinished
          (QSequentialAnimationGroupPrivate *this)

{
  QBindingStorage *this_00;
  QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
  *this_01;
  QList<int> *this_02;
  QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
  *data;
  QObject *this_03;
  QBindingStatus *pQVar1;
  QAbstractAnimation *pQVar2;
  int iVar3;
  parameter_type pVar4;
  pointer piVar5;
  iterator iVar6;
  int iVar7;
  long i;
  long in_FS_OFFSET;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_03 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
            super_QObjectPrivate.super_QObjectData.q_ptr;
  i = (this->actualDuration).d.size;
  this_02 = &this->actualDuration;
  if (i < (long)this->currentAnimationIndex + 1) {
    do {
      local_3c = -1;
      QtPrivate::QPodArrayOps<int>::emplace<int&>((QPodArrayOps<int> *)this_02,i,&local_3c);
      QList<int>::end(this_02);
      i = (this->actualDuration).d.size;
    } while (i < (long)this->currentAnimationIndex + 1);
  }
  data = &this->currentAnimation;
  this_00 = &(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
             super_QObjectPrivate.super_QObjectData.bindingStorage;
  pQVar1 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.super_QObjectPrivate
           .super_QObjectData.bindingStorage.bindingStatus;
  if ((pQVar1 != (QBindingStatus *)0x0) &&
     (pQVar1->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
    QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data);
  }
  iVar3 = QAbstractAnimation::currentTime
                    ((QAbstractAnimation *)
                     (this->currentAnimation).super_QPropertyData<QAbstractAnimation_*>.val);
  iVar7 = this->currentAnimationIndex;
  piVar5 = QList<int>::data(this_02);
  piVar5[iVar7] = iVar3;
  pQVar1 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.super_QObjectPrivate
           .super_QObjectData.bindingStorage.bindingStatus;
  if ((pQVar1 != (QBindingStatus *)0x0) &&
     (pQVar1->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
    QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data);
  }
  QObject::disconnect(&((this->currentAnimation).super_QPropertyData<QAbstractAnimation_*>.val)->
                       super_QObject,(char *)0x0,
                      (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
                      super_QObjectPrivate.super_QObjectData.q_ptr,
                      "1_q_uncontrolledAnimationFinished()");
  this_01 = &(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.direction;
  pVar4 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
          ::value(this_01);
  if (pVar4 == Forward) {
    pQVar1 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
             super_QObjectPrivate.super_QObjectData.bindingStorage.bindingStatus;
    if ((pQVar1 != (QBindingStatus *)0x0) &&
       (pQVar1->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
      QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data);
    }
    pQVar2 = (this->currentAnimation).super_QPropertyData<QAbstractAnimation_*>.val;
    iVar6 = QList<QAbstractAnimation_*>::end(&(this->super_QAnimationGroupPrivate).animations);
    if (pQVar2 != iVar6.i[-1]) goto LAB_003bac9a;
  }
  else {
LAB_003bac9a:
    pVar4 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
            ::value(this_01);
    if ((pVar4 != Backward) || (this->currentAnimationIndex != 0)) {
      pVar4 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
              ::value(this_01);
      if (pVar4 == Forward) {
        iVar7 = this->currentAnimationIndex + 1;
      }
      else {
        iVar7 = this->currentAnimationIndex + -1;
      }
      setCurrentAnimation(this,iVar7,false);
      goto LAB_003bacdd;
    }
  }
  QAbstractAnimation::stop((QAbstractAnimation *)this_03);
LAB_003bacdd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSequentialAnimationGroupPrivate::_q_uncontrolledAnimationFinished()
{
    Q_Q(QSequentialAnimationGroup);
    Q_ASSERT(qobject_cast<QAbstractAnimation *>(q->sender()) == currentAnimation);

    // we trust the duration returned by the animation
    while (actualDuration.size() < (currentAnimationIndex + 1))
        actualDuration.append(-1);
    actualDuration[currentAnimationIndex] = currentAnimation->currentTime();

    disconnectUncontrolledAnimation(currentAnimation);

    if ((direction == QAbstractAnimation::Forward && currentAnimation == animations.last())
        || (direction == QAbstractAnimation::Backward && currentAnimationIndex == 0)) {
        // we don't handle looping of a group with undefined duration
        q->stop();
    } else if (direction == QAbstractAnimation::Forward) {
        // set the current animation to be the next one
        setCurrentAnimation(currentAnimationIndex + 1);
    } else {
        // set the current animation to be the previous one
        setCurrentAnimation(currentAnimationIndex - 1);
    }
}